

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

transition_table_type<afsm::test::events::start_object> *
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::test::json_parser_def::context,unsigned_long>
::transition_table<afsm::test::events::start_object,0ul,1ul,2ul,3ul>
          (indexes_tuple<0UL,_1UL,_2UL,_3UL> *param_1)

{
  if (transition_table<afsm::test::events::start_object,0ul,1ul,2ul,3ul>(psst::meta::indexes_tuple<0ul,1ul,2ul,3ul>const&)
      ::_table == '\0') {
    transition_table<afsm::test::events::start_object,0ul,1ul,2ul,3ul>();
  }
  return &state_transition_table<afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::test::json_parser_def::context,_unsigned_long>
          ::transition_table<afsm::test::events::start_object,_0UL,_1UL,_2UL,_3UL>::_table;
}

Assistant:

static transition_table_type< Event > const&
    transition_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        using event_type = typename ::std::decay<Event>::type;
        using event_transitions = typename ::psst::meta::find_if<
                def::handles_event< event_type >::template type, transitions_tuple >::type;
        static transition_table_type< Event > _table {{
            typename detail::transition_action_selector< fsm_type, this_type,
                typename ::psst::meta::find_if<
                    def::originates_from<
                        typename inner_states_def::template type< Indexes >
                    >::template type,
                    event_transitions
                >::type >::type{} ...
        }};
        return _table;
    }